

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fits_hdecompress.c
# Opt level: O0

void unshuffle(int *a,int n,int n2,int *tmp)

{
  int iVar1;
  int *local_40;
  int *pt;
  int *p2;
  int *p1;
  int nhalf;
  int i;
  int *tmp_local;
  int n2_local;
  int n_local;
  int *a_local;
  
  iVar1 = n + 1 >> 1;
  p2 = a + n2 * iVar1;
  local_40 = tmp;
  for (p1._4_4_ = iVar1; p1._4_4_ < n; p1._4_4_ = p1._4_4_ + 1) {
    *local_40 = *p2;
    p2 = p2 + n2;
    local_40 = local_40 + 1;
  }
  pt = a + n2 * (iVar1 + -1);
  p2 = a + n2 * (iVar1 + -1) * 2;
  p1._4_4_ = iVar1;
  while (p1._4_4_ = p1._4_4_ + -1, -1 < p1._4_4_) {
    *p2 = *pt;
    pt = pt + -(long)n2;
    p2 = p2 + -(long)(n2 * 2);
  }
  p2 = a + n2;
  local_40 = tmp;
  for (p1._4_4_ = 1; p1._4_4_ < n; p1._4_4_ = p1._4_4_ + 2) {
    *p2 = *local_40;
    p2 = p2 + n2 * 2;
    local_40 = local_40 + 1;
  }
  return;
}

Assistant:

static void
unshuffle(int a[], int n, int n2, int tmp[])
/*
int a[];	 array to shuffle					
int n;		 number of elements to shuffle	
int n2;		 second dimension					
int tmp[];	 scratch storage					
*/
{
int i;
int nhalf;
int *p1, *p2, *pt;
 
	/*
	 * copy 2nd half of array to tmp
	 */
	nhalf = (n+1)>>1;
	pt = tmp;
	p1 = &a[n2*nhalf];				/* pointer to a[i]			*/
	for (i=nhalf; i<n; i++) {
		*pt = *p1;
		p1 += n2;
		pt += 1;
	}
	/*
	 * distribute 1st half of array to even elements
	 */
	p2 = &a[ n2*(nhalf-1) ];		/* pointer to a[i]			*/
	p1 = &a[(n2*(nhalf-1))<<1];		/* pointer to a[2*i]		*/
	for (i=nhalf-1; i >= 0; i--) {
		*p1 = *p2;
		p2 -= n2;
		p1 -= (n2+n2);
	}
	/*
	 * now distribute 2nd half of array (in tmp) to odd elements
	 */
	pt = tmp;
	p1 = &a[n2];					/* pointer to a[i]			*/
	for (i=1; i<n; i += 2) {
		*p1 = *pt;
		p1 += (n2+n2);
		pt += 1;
	}
}